

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# infinite_impulse_response_digital_filter.cc
# Opt level: O2

void __thiscall
sptk::InfiniteImpulseResponseDigitalFilter::InfiniteImpulseResponseDigitalFilter
          (InfiniteImpulseResponseDigitalFilter *this,
          vector<double,_std::allocator<double>_> *denominator_coefficients,
          vector<double,_std::allocator<double>_> *numerator_coefficients)

{
  int iVar1;
  int iVar2;
  int iVar3;
  
  this->_vptr_InfiniteImpulseResponseDigitalFilter =
       (_func_int **)&PTR__InfiniteImpulseResponseDigitalFilter_0010fcd0;
  std::vector<double,_std::allocator<double>_>::vector
            (&this->denominator_coefficients_,denominator_coefficients);
  std::vector<double,_std::allocator<double>_>::vector
            (&this->numerator_coefficients_,numerator_coefficients);
  iVar1 = (int)((ulong)((long)(denominator_coefficients->
                              super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                              super__Vector_impl_data._M_finish -
                       (long)(denominator_coefficients->
                             super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                             super__Vector_impl_data._M_start) >> 3);
  this->num_denominator_order_ = iVar1 + -1;
  iVar2 = (int)((ulong)((long)(numerator_coefficients->
                              super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                              super__Vector_impl_data._M_finish -
                       (long)(numerator_coefficients->
                             super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                             super__Vector_impl_data._M_start) >> 3);
  iVar3 = iVar1 + -1;
  if (iVar1 < iVar2) {
    iVar3 = iVar2 + -1;
  }
  this->num_numerator_order_ = iVar2 + -1;
  this->num_filter_order_ = iVar3;
  this->is_valid_ = 0 < iVar2 && 0 < iVar1;
  return;
}

Assistant:

InfiniteImpulseResponseDigitalFilter::InfiniteImpulseResponseDigitalFilter(
    const std::vector<double>& denominator_coefficients,
    const std::vector<double>& numerator_coefficients)
    : denominator_coefficients_(denominator_coefficients),
      numerator_coefficients_(numerator_coefficients),
      num_denominator_order_(static_cast<int>(denominator_coefficients.size()) -
                             1),
      num_numerator_order_(static_cast<int>(numerator_coefficients.size()) - 1),
      num_filter_order_(std::max(num_denominator_order_, num_numerator_order_)),
      is_valid_(true) {
  if (num_denominator_order_ < 0 || num_numerator_order_ < 0) {
    is_valid_ = false;
    return;
  }
}